

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O0

string * __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadLine_abi_cxx11_
          (string *__return_storage_ptr__,OgreBinarySerializer *this)

{
  bool bVar1;
  char cVar2;
  char c;
  OgreBinarySerializer *this_local;
  string *str;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  while ((bVar1 = AtEnd(this), ((bVar1 ^ 0xffU) & 1) != 0 &&
         (cVar2 = Read<char>(this), cVar2 != '\n'))) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,cVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OgreBinarySerializer::ReadLine()
{
    std::string str;
    while(!AtEnd())
    {
        char c = Read<char>();
        if (c == '\n')
            break;
        str += c;
    }
    return str;
}